

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.cxx
# Opt level: O1

unique_ptr<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>_> __thiscall
cmList::TransformSelector::NewAT
          (TransformSelector *this,vector<long,_std::allocator<long>_> *indexes)

{
  _func_int **pp_Var1;
  undefined5 uStack_3d;
  undefined3 uStack_38;
  undefined4 local_35;
  undefined1 local_31;
  
  pp_Var1 = (_func_int **)operator_new(0x40);
  *pp_Var1 = (_func_int *)&PTR__TransformSelector_00a50070;
  pp_Var1[1] = (_func_int *)(pp_Var1 + 3);
  *(undefined2 *)(pp_Var1 + 3) = 0x5441;
  *(undefined1 *)((long)pp_Var1 + 0x1a) = 0;
  *(ulong *)((long)pp_Var1 + 0x1b) = CONCAT35(uStack_38,uStack_3d);
  *(undefined4 *)((long)pp_Var1 + 0x23) = local_35;
  *(undefined1 *)((long)pp_Var1 + 0x27) = local_31;
  pp_Var1[2] = (_func_int *)0x2;
  *pp_Var1 = (_func_int *)&PTR__TransformSelectorIndexes_00a50130;
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)(pp_Var1 + 5),indexes);
  *pp_Var1 = (_func_int *)&PTR__TransformSelectorIndexes_00a500c0;
  this->_vptr_TransformSelector = pp_Var1;
  return (__uniq_ptr_data<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>,_true,_true>
          )(__uniq_ptr_data<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<cmList::TransformSelector> cmList::TransformSelector::NewAT(
  std::vector<index_type> const& indexes)
{
  return cm::make_unique<TransformSelectorAt>(indexes);
}